

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_util.h
# Opt level: O0

vector<char32_t,_std::allocator<char32_t>_> * cpsm::decode<cpsm::Utf8StringTraits>(string_ref str)

{
  string_ref str_00;
  size_t in_RDX;
  char *in_RSI;
  vector<char32_t,_std::allocator<char32_t>_> *in_RDI;
  vector<char32_t,_std::allocator<char32_t>_> *vec;
  vector<char32_t,_std::allocator<char32_t>_> *in_stack_ffffffffffffffc0;
  
  std::vector<char32_t,_std::allocator<char32_t>_>::vector
            ((vector<char32_t,_std::allocator<char32_t>_> *)0x13c659);
  str_00.len_ = in_RDX;
  str_00.ptr_ = in_RSI;
  decode_to<cpsm::Utf8StringTraits>(str_00,in_stack_ffffffffffffffc0);
  return in_RDI;
}

Assistant:

std::vector<typename StringTraits::Char> decode(boost::string_ref const str) {
  std::vector<typename StringTraits::Char> vec;
  decode_to<StringTraits>(str, vec);
  return vec;
}